

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCoding.h
# Opt level: O0

void __thiscall
llbuild::basic::BinaryDecoder::read<llbuild::basic::FileTimestamp>
          (BinaryDecoder *this,FileTimestamp *value)

{
  FileTimestamp *value_local;
  BinaryDecoder *this_local;
  
  BinaryCodingTraits<llbuild::basic::FileTimestamp>::decode(value,this);
  return;
}

Assistant:

void read(T& value) {
    BinaryCodingTraits<T>::decode(value, *this);
  }